

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebugIfHasDebugStreamContainer<QHash<QString,_QVariant>,_QString,_QVariant>
operator<<(QDebug debug,QHash<QString,_QVariant> *hash)

{
  QHash<QString,_QVariant> *in_RDX;
  long in_FS_OFFSET;
  QDebug local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.stream = (Stream *)hash->d;
  hash->d = (Data *)0x0;
  QtPrivate::printAssociativeContainer<QHash<QString,QVariant>>
            ((QtPrivate *)debug.stream,(Stream *)&local_18,"QHash",in_RDX);
  QDebug::~QDebug(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QDebugIfHasDebugStreamContainer<QHash<QString,_QVariant>,_QString,_QVariant>)
           debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebugIfHasDebugStreamContainer<QHash<Key, T>, Key, T> operator<<(QDebug debug, const QHash<Key, T> &hash)
{
    return QtPrivate::printAssociativeContainer(std::move(debug), "QHash", hash);
}